

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

char * glcts::GetModeStr(GLenum mode)

{
  char *pcStack_10;
  GLenum mode_local;
  
  switch(mode) {
  case 0x9294:
    pcStack_10 = "GL_MULTIPLY_KHR";
    break;
  case 0x9295:
    pcStack_10 = "GL_SCREEN_KHR";
    break;
  case 0x9296:
    pcStack_10 = "GL_OVERLAY_KHR";
    break;
  case 0x9297:
    pcStack_10 = "GL_DARKEN_KHR";
    break;
  case 0x9298:
    pcStack_10 = "GL_LIGHTEN_KHR";
    break;
  case 0x9299:
    pcStack_10 = "GL_COLORDODGE_KHR";
    break;
  case 0x929a:
    pcStack_10 = "GL_COLORBURN_KHR";
    break;
  case 0x929b:
    pcStack_10 = "GL_HARDLIGHT_KHR";
    break;
  case 0x929c:
    pcStack_10 = "GL_SOFTLIGHT_KHR";
    break;
  default:
    pcStack_10 = "Blend mode not from GL_KHR_blend_equation_advanced.";
    break;
  case 0x929e:
    pcStack_10 = "GL_DIFFERENCE_KHR";
    break;
  case 0x92a0:
    pcStack_10 = "GL_EXCLUSION_KHR";
    break;
  case 0x92ad:
    pcStack_10 = "GL_HSL_HUE_KHR";
    break;
  case 0x92ae:
    pcStack_10 = "GL_HSL_SATURATION_KHR";
    break;
  case 0x92af:
    pcStack_10 = "GL_HSL_COLOR_KHR";
    break;
  case 0x92b0:
    pcStack_10 = "GL_HSL_LUMINOSITY_KHR";
  }
  return pcStack_10;
}

Assistant:

static const char* GetModeStr(glw::GLenum mode)
{
	switch (mode)
	{
	case GL_MULTIPLY_KHR:
		return "GL_MULTIPLY_KHR";
	case GL_SCREEN_KHR:
		return "GL_SCREEN_KHR";
	case GL_OVERLAY_KHR:
		return "GL_OVERLAY_KHR";
	case GL_DARKEN_KHR:
		return "GL_DARKEN_KHR";
	case GL_LIGHTEN_KHR:
		return "GL_LIGHTEN_KHR";
	case GL_COLORDODGE_KHR:
		return "GL_COLORDODGE_KHR";
	case GL_COLORBURN_KHR:
		return "GL_COLORBURN_KHR";
	case GL_HARDLIGHT_KHR:
		return "GL_HARDLIGHT_KHR";
	case GL_SOFTLIGHT_KHR:
		return "GL_SOFTLIGHT_KHR";
	case GL_DIFFERENCE_KHR:
		return "GL_DIFFERENCE_KHR";
	case GL_EXCLUSION_KHR:
		return "GL_EXCLUSION_KHR";
	case GL_HSL_HUE_KHR:
		return "GL_HSL_HUE_KHR";
	case GL_HSL_SATURATION_KHR:
		return "GL_HSL_SATURATION_KHR";
	case GL_HSL_COLOR_KHR:
		return "GL_HSL_COLOR_KHR";
	case GL_HSL_LUMINOSITY_KHR:
		return "GL_HSL_LUMINOSITY_KHR";
	default:
		DE_ASSERT(DE_FALSE && "Blend mode not from GL_KHR_blend_equation_advanced.");
		return "Blend mode not from GL_KHR_blend_equation_advanced.";
	}
}